

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption(UninterpretedOption *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  InternalMetadataWithArena *in_stack_ffffffffffffffc0;
  UninterpretedOption *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__UninterpretedOption_008db330;
  this_00 = (UninterpretedOption *)(in_RDI + 1);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x513c62);
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)0x513c75);
  SharedCtor(this_00);
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.UninterpretedOption)
}